

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBase32.cxx
# Opt level: O0

string * __thiscall
cmBase32Encoder::encodeString_abi_cxx11_
          (string *__return_storage_ptr__,cmBase32Encoder *this,uchar *input,size_t len,bool padding
          )

{
  uchar *puVar1;
  size_t local_80;
  size_t ii_2;
  size_t numPad;
  size_t ii_1;
  size_t ii;
  size_t sStack_58;
  uchar extended [5];
  size_t remain;
  uchar *end;
  char buffer [8];
  bool padding_local;
  size_t len_local;
  uchar *input_local;
  cmBase32Encoder *this_local;
  string *res;
  
  buffer[0] = '\0';
  buffer[1] = padding;
  unique0x10000169 = len;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  puVar1 = input + stack0xffffffffffffffd8;
  for (len_local = (size_t)input; (uchar *)(len_local + 5) <= puVar1; len_local = len_local + 5) {
    Base32Encode5((uchar *)len_local,(char *)((long)&end + 6));
    std::__cxx11::string::append((char *)__return_storage_ptr__,(long)&end + 6);
  }
  sStack_58 = (long)puVar1 - len_local;
  if (sStack_58 != 0) {
    for (ii_1 = 0; ii_1 != sStack_58; ii_1 = ii_1 + 1) {
      *(undefined1 *)((long)&ii + ii_1 + 3) = *(undefined1 *)(len_local + ii_1);
    }
    for (numPad = sStack_58; numPad != 5; numPad = numPad + 1) {
      *(undefined1 *)((long)&ii + numPad + 3) = 0;
    }
    Base32Encode5((uchar *)((long)&ii + 3),(char *)((long)&end + 6));
    ii_2 = 0;
    switch(sStack_58) {
    case 1:
      ii_2 = 6;
      break;
    case 2:
      ii_2 = 4;
      break;
    case 3:
      ii_2 = 3;
      break;
    case 4:
      ii_2 = 1;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__,(long)&end + 6);
    if ((buffer[1] & 1U) != 0) {
      for (local_80 = 0; local_80 != ii_2; local_80 = local_80 + 1) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmBase32Encoder::encodeString(const unsigned char* input,
                                          size_t len, bool padding)
{
  std::string res;

  static const size_t blockSize = 5;
  static const size_t bufferSize = 8;
  char buffer[bufferSize];

  const unsigned char* end = input + len;
  while ((input + blockSize) <= end) {
    Base32Encode5(input, buffer);
    res.append(buffer, bufferSize);
    input += blockSize;
  }

  size_t remain = static_cast<size_t>(end - input);
  if (remain != 0) {
    // Temporary source buffer filled up with 0s
    unsigned char extended[blockSize];
    for (size_t ii = 0; ii != remain; ++ii) {
      extended[ii] = input[ii];
    }
    for (size_t ii = remain; ii != blockSize; ++ii) {
      extended[ii] = 0;
    }

    Base32Encode5(extended, buffer);
    size_t numPad(0);
    switch (remain) {
      case 1:
        numPad = 6;
        break;
      case 2:
        numPad = 4;
        break;
      case 3:
        numPad = 3;
        break;
      case 4:
        numPad = 1;
        break;
      default:
        break;
    }
    res.append(buffer, bufferSize - numPad);
    if (padding) {
      for (size_t ii = 0; ii != numPad; ++ii) {
        res.push_back(paddingChar);
      }
    }
  }

  return res;
}